

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

ResultValue * __thiscall
Operator::apply(ResultValue *__return_storage_ptr__,Operator *this,ResultValue op)

{
  runtime_error *this_00;
  ResultValue local_38;
  
  if (this->mIsUnary == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not an unary operator.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38.mComplexValue._M_value._8_8_ = op.mComplexValue._M_value._8_8_;
  local_38.mFloatValue._0_4_ = op.mFloatValue._0_4_;
  local_38.mFloatValue._4_4_ = op.mFloatValue._4_4_;
  local_38.mComplexValue._M_value._0_4_ = op.mComplexValue._M_value._0_4_;
  local_38.mComplexValue._M_value._4_4_ = op.mComplexValue._M_value._4_4_;
  local_38.mType = op.mType;
  local_38._4_4_ = op._4_4_;
  local_38.mIntValue._0_4_ = (undefined4)op.mIntValue;
  local_38.mIntValue._4_4_ = op.mIntValue._4_4_;
  if ((this->mUnaryFn).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mUnaryFn)._M_invoker)(__return_storage_ptr__,(_Any_data *)&this->mUnaryFn,&local_38);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

ResultValue Operator::apply(ResultValue op) const {
	if (!mIsUnary) {
		throw std::runtime_error("Not an unary operator.");
	}

	return mUnaryFn(op);
}